

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_0::DrawGridTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DrawGridTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  VkQueue queue;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  DeviceInterface *vkd;
  VkDevice pVVar2;
  Allocation *pAVar3;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)8> *pHVar6;
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_188;
  VkDescriptorSetLayout local_158;
  deUint64 local_150;
  deUint64 local_148;
  deUint64 local_140;
  Move<vk::VkCommandBuffer_s_*> local_138;
  RefData<vk::VkCommandBuffer_s_*> local_118;
  undefined1 local_f8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_a8;
  undefined1 local_88 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkBufferCopy copyRegions [2];
  VkDeviceSize secondChunkOffset;
  VkDeviceSize firstChunkOffset;
  DeviceInterface *vk;
  DrawGridTestInstance *this_local;
  
  (*(this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
    _vptr_TestInstance[3])();
  vkd = SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  pVVar2 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_stagingBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_stagingBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar3);
  ::vk::flushMappedMemoryRange(vkd,pVVar2,memory,offset,this->m_stagingBufferSize);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pVVar2 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeCommandPool(&local_c8,vkd,pVVar2,
                  (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data.deleter.m_deviceIface._0_4_ = (int)local_a8.deleter.m_deviceIface;
  data.object.m_internal = local_a8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_a8.deleter.m_device;
  data.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_88,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_c8);
  pVVar2 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_88);
  local_140 = pHVar4->m_internal;
  ::vk::allocateCommandBuffer
            (&local_138,vkd,pVVar2,(VkCommandPool)local_140,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_118.deleter.m_deviceIface;
  data_00.object = local_118.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_118.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_118.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_f8,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_138);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  beginCommandBuffer(vkd,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_148 = pHVar6->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_150 = pHVar6->m_internal;
  (*vkd->_vptr_DeviceInterface[0x5f])
            (vkd,pVVar1,local_148,local_150,2,
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  endCommandBuffer(vkd,*ppVVar5);
  pVVar2 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  queue = (this->super_SparseBufferTestInstance).m_universalQueue.queueHandle;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_f8);
  submitCommandsAndWait
            (vkd,pVVar2,queue,*ppVVar5,0,(VkSemaphore *)0x0,(VkPipelineStageFlags *)0x0,0,
             (VkSemaphore *)0x0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_88);
  ::vk::Handle<(vk::HandleType)19>::Handle(&local_158,0);
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_188._M_t._M_impl._0_8_ = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::map(&local_188);
  SparseBufferTestInstance::draw
            (&this->super_SparseBufferTestInstance,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,local_158,
             &local_188);
  std::
  map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~map(&local_188);
  SparseBufferTestInstance::verifyDrawResult
            (__return_storage_ptr__,&this->super_SparseBufferTestInstance);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		initializeBuffers();

		const DeviceInterface&	vk	= getDeviceInterface();

		// Upload to the sparse buffer
		{
			flushMappedMemoryRange(vk, getDevice(), m_stagingBufferAlloc->getMemory(), m_stagingBufferAlloc->getOffset(), m_stagingBufferSize);

			VkDeviceSize	firstChunkOffset	= 0ull;
			VkDeviceSize	secondChunkOffset	= m_perDrawBufferOffset;

			if (m_residency)
				secondChunkOffset += m_perDrawBufferOffset;

			if (m_aliased)
				firstChunkOffset = secondChunkOffset + m_perDrawBufferOffset;

			const VkBufferCopy copyRegions[] =
			{
				{
					0ull,						// VkDeviceSize    srcOffset;
					firstChunkOffset,			// VkDeviceSize    dstOffset;
					m_perDrawBufferOffset,		// VkDeviceSize    size;
				},
				{
					m_perDrawBufferOffset,		// VkDeviceSize    srcOffset;
					secondChunkOffset,			// VkDeviceSize    dstOffset;
					m_perDrawBufferOffset,		// VkDeviceSize    size;
				},
			};

			const Unique<VkCommandPool>		cmdPool		(makeCommandPool(vk, getDevice(), m_universalQueue.queueFamilyIndex));
			const Unique<VkCommandBuffer>	cmdBuffer	(allocateCommandBuffer(vk, getDevice(), *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

			beginCommandBuffer	(vk, *cmdBuffer);
			vk.cmdCopyBuffer	(*cmdBuffer, *m_stagingBuffer, *m_sparseBuffer, DE_LENGTH_OF_ARRAY(copyRegions), copyRegions);
			endCommandBuffer	(vk, *cmdBuffer);

			submitCommandsAndWait(vk, getDevice(), m_universalQueue.queueHandle, *cmdBuffer);
		}

		draw(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

		return verifyDrawResult();
	}